

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

Amount __thiscall cfd::core::ConfidentialValue::GetAmount(ConfidentialValue *this)

{
  undefined8 extraout_RDX;
  Amount AVar1;
  Amount AVar2;
  ByteData local_58;
  ConfidentialValue *local_40;
  undefined1 local_38;
  ConfidentialValue *local_30;
  undefined1 local_28;
  ConfidentialValue *local_20;
  ConfidentialValue *this_local;
  Amount amount;
  
  local_20 = this;
  AVar1 = Amount::CreateBySatoshiAmount(0);
  local_30 = (ConfidentialValue *)AVar1.amount_;
  local_28 = AVar1.ignore_check_;
  amount.amount_._0_1_ = local_28;
  if (this->version_ == '\x01') {
    this_local = local_30;
    GetData(&local_58,this);
    AVar1 = ConvertFromConfidentialValue(&local_58);
    local_40 = (ConfidentialValue *)AVar1.amount_;
    local_38 = AVar1.ignore_check_;
    this_local = local_40;
    amount.amount_._0_1_ = local_38;
    ByteData::~ByteData(&local_58);
    AVar1._8_8_ = extraout_RDX;
    AVar1.amount_ = (int64_t)this_local;
  }
  this_local = (ConfidentialValue *)AVar1.amount_;
  AVar2._9_7_ = AVar1._9_7_;
  AVar2.ignore_check_ = (bool)(undefined1)amount.amount_;
  AVar2.amount_ = (int64_t)this_local;
  return AVar2;
}

Assistant:

Amount ConfidentialValue::GetAmount() const {
  Amount amount = Amount::CreateBySatoshiAmount(0);
  if (version_ == 1) {
    amount = ConvertFromConfidentialValue(GetData());
  }
  return amount;
}